

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifyLAW.hpp
# Opt level: O1

void njoy::ENDFtk::section::Type<26>::ReactionProduct::verifyLAW
               (int multiplicityLAW,int distributionLaw)

{
  undefined8 *puVar1;
  
  if (multiplicityLAW == distributionLaw) {
    return;
  }
  tools::Log::error<char_const*>("Inconsistent LAW between multiplicity and distribution data");
  tools::Log::info<char_const*,int>("Multiplicity LAW: {}",multiplicityLAW);
  tools::Log::info<char_const*,int>("Distribution LAW: {}",distributionLaw);
  puVar1 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar1 = getenv;
  __cxa_throw(puVar1,&std::exception::typeinfo,std::exception::~exception);
}

Assistant:

static void
verifyLAW( int multiplicityLAW, int distributionLaw ) {

  if ( multiplicityLAW != distributionLaw ) {
    Log::error( "Inconsistent LAW between multiplicity and distribution data" );
    Log::info( "Multiplicity LAW: {}", multiplicityLAW );
    Log::info( "Distribution LAW: {}", distributionLaw );
    throw std::exception();
  }
}